

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O3

int coda_ascbin_cursor_get_record_field_available_status
              (coda_cursor *cursor,long index,int *available)

{
  coda_expression *expr;
  int iVar1;
  long in_RAX;
  coda_type *pcVar2;
  long available_index;
  long local_18;
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  if ((index < 0) || ((long)pcVar2[1].name <= index)) {
    coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",index);
LAB_0011a0a6:
    iVar1 = -1;
  }
  else {
    if (pcVar2[1].attributes == (coda_type_record *)0x0) {
      expr = *(coda_expression **)(*(long *)(pcVar2[1].description + index * 8) + 0x20);
      if (expr == (coda_expression *)0x0) {
        *available = 1;
      }
      else {
        iVar1 = coda_expression_eval_bool(expr,cursor,available);
        if (iVar1 != 0) {
          return -1;
        }
      }
    }
    else {
      local_18 = in_RAX;
      iVar1 = coda_cursor_get_available_union_field_index(cursor,&local_18);
      if (iVar1 != 0) goto LAB_0011a0a6;
      *available = (uint)(local_18 == index);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int coda_ascbin_cursor_get_record_field_available_status(const coda_cursor *cursor, long index, int *available)
{
    coda_type_record *record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (index < 0 || index >= record->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                       record->num_fields);
        return -1;
    }

    if (record->union_field_expr != NULL)
    {
        long available_index;

        if (coda_cursor_get_available_union_field_index(cursor, &available_index) != 0)
        {
            return -1;
        }
        *available = (index == available_index);
    }
    else if (record->field[index]->available_expr != NULL)
    {
        if (coda_expression_eval_bool(record->field[index]->available_expr, cursor, available) != 0)
        {
            return -1;
        }
    }
    else
    {
        *available = 1;
    }

    return 0;
}